

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::TrackTempObjectSyms(GlobOpt *this,Instr *instr,RegOpnd *opnd)

{
  ushort uVar1;
  BVIndex i;
  BasicBlock *pBVar2;
  Type pJVar3;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  bool bVar7;
  bool bVar8;
  uint32 offset;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  StackSym *this_01;
  BVSparse<Memory::JitArenaAllocator> *pBVar11;
  IntConstOpnd *this_02;
  JITTimeFunctionBody *this_03;
  PropertyIdArray *pPVar12;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar13;
  char cVar14;
  undefined1 local_58 [8];
  StackLiteralInitFldData data;
  StackSym *sym;
  
  if (((instr->field_0x36 & 8) != 0) &&
     (bVar5 = ObjectTempVerify::CanMarkTemp(instr,(BackwardPass *)0x0), !bVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x41b4,
                       "(!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr))",
                       "!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr)");
    if (!bVar5) goto LAB_00442a5c;
    *puVar9 = 0;
  }
  pBVar2 = this->currentBlock;
  bVar5 = OpCodeAttr::TempObjectProducing(instr->m_opcode);
  if (bVar5) {
    uVar1 = *(ushort *)&instr->field_0x36;
    if ((uVar1 & 8) == 0) {
      bVar5 = false;
    }
    else {
      bVar5 = ObjectTemp::CanStoreTemp(instr);
    }
    cVar14 = (char)((uVar1 & 8) >> 3);
  }
  else {
    bVar5 = OpCodeAttr::TempObjectTransfer(instr->m_opcode);
    if (bVar5) {
      if ((pBVar2->globOptData).maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_004424a1:
        bVar8 = false;
      }
      else {
        bVar5 = IR::Opnd::IsRegOpnd(instr->m_src1);
        if (bVar5) {
          pBVar11 = (pBVar2->globOptData).maybeTempObjectSyms;
          pRVar10 = IR::Opnd::AsRegOpnd(instr->m_src1);
          BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pBVar11,(pRVar10->m_sym->super_Sym).m_id);
          bVar8 = true;
          if (BVar6 == '\0') goto LAB_0044243e;
        }
        else {
LAB_0044243e:
          if ((instr->m_src2 == (Opnd *)0x0) || (bVar5 = IR::Opnd::IsRegOpnd(instr->m_src2), !bVar5)
             ) goto LAB_004424a1;
          pBVar11 = (pBVar2->globOptData).maybeTempObjectSyms;
          pRVar10 = IR::Opnd::AsRegOpnd(instr->m_src2);
          BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pBVar11,(pRVar10->m_sym->super_Sym).m_id);
          bVar8 = BVar6 != '\0';
        }
      }
      if ((pBVar2->globOptData).canStoreTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0
         ) {
        bVar5 = false;
      }
      else {
        bVar5 = IR::Opnd::IsRegOpnd(instr->m_src1);
        if (bVar5) {
          pBVar11 = (pBVar2->globOptData).canStoreTempObjectSyms;
          pRVar10 = IR::Opnd::AsRegOpnd(instr->m_src1);
          BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pBVar11,(pRVar10->m_sym->super_Sym).m_id);
          if (BVar6 != '\0') {
            if (instr->m_src2 == (Opnd *)0x0) {
LAB_0044252b:
              bVar5 = true;
              if ((instr->field_0x36 & 8) == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar9 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                   ,0x41cd,"(!canStoreTemp || instr->dstIsTempObject)",
                                   "!canStoreTemp || instr->dstIsTempObject");
                if (!bVar7) goto LAB_00442a5c;
                *puVar9 = 0;
              }
              goto LAB_00442595;
            }
            bVar5 = IR::Opnd::IsRegOpnd(instr->m_src2);
            if (bVar5) {
              pBVar11 = (pBVar2->globOptData).canStoreTempObjectSyms;
              pRVar10 = IR::Opnd::AsRegOpnd(instr->m_src2);
              BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                (pBVar11,(pRVar10->m_sym->super_Sym).m_id);
              if (BVar6 != '\0') goto LAB_0044252b;
            }
          }
        }
        bVar5 = false;
      }
LAB_00442595:
      if (bVar8) {
        cVar14 = '\x01';
        if ((instr->field_0x36 & 8) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x41ce,"(!maybeTemp || instr->dstIsTempObject)",
                             "!maybeTemp || instr->dstIsTempObject");
          if (!bVar8) goto LAB_00442a5c;
          *puVar9 = 0;
        }
      }
      else {
        cVar14 = '\0';
      }
    }
    else {
      cVar14 = '\0';
      bVar5 = false;
    }
  }
  this_01 = opnd->m_sym;
  if ((this_01->m_type == TyVar) ||
     (data._8_8_ = this_01, this_01 = StackSym::GetVarEquivSym(this_01,(Func *)0x0),
     this_01 != (StackSym *)0x0)) {
    i = (this_01->super_Sym).m_id;
    data._8_8_ = this_01;
    if (cVar14 == '\0') {
      if (bVar5 != false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x4213,"(!canStoreTemp)","!canStoreTemp");
        if (!bVar5) goto LAB_00442a5c;
        *puVar9 = 0;
      }
      pBVar11 = (pBVar2->globOptData).maybeTempObjectSyms;
      this_00 = (pBVar2->globOptData).canStoreTempObjectSyms;
      if (pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        if (this_00 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x421e,"(!globOptData.canStoreTempObjectSyms)",
                             "!globOptData.canStoreTempObjectSyms");
          if (!bVar5) goto LAB_00442a5c;
          *puVar9 = 0;
        }
      }
      else {
        if (this_00 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          BVSparse<Memory::JitArenaAllocator>::Clear(this_00,i);
          pBVar11 = (pBVar2->globOptData).maybeTempObjectSyms;
        }
        BVSparse<Memory::JitArenaAllocator>::Clear(pBVar11,i);
      }
      if (this->prePassLoop != (Loop *)0x0) {
        return;
      }
      pBVar13 = (pBVar2->globOptData).stackLiteralInitFldDataMap;
      if (pBVar13 ==
          (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)0x0) {
        return;
      }
      if (pBVar13->count == pBVar13->freeCount) {
        return;
      }
      bVar5 = JsUtil::
              BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(pBVar13,(StackSym **)&data.currentInitFldCount);
      if (!bVar5) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4225,
                         "(this->IsLoopPrePass() || globOptData.stackLiteralInitFldDataMap == nullptr || globOptData.stackLiteralInitFldDataMap->Count() == 0 || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym))"
                         ,
                         "this->IsLoopPrePass() || globOptData.stackLiteralInitFldDataMap == nullptr || globOptData.stackLiteralInitFldDataMap->Count() == 0 || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym)"
                        );
      if (bVar5) {
        *puVar9 = 0;
        return;
      }
LAB_00442a5c:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    if (opnd->m_sym != this_01) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x41e0,"(opnd->m_sym == sym)","opnd->m_sym == sym");
      if (!bVar8) goto LAB_00442a5c;
      *puVar9 = 0;
    }
    pBVar11 = (pBVar2->globOptData).maybeTempObjectSyms;
    if (pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
      pJVar3 = this->alloc;
      pBVar11->head = (Type_conflict)0x0;
      pBVar11->lastFoundIndex = (Type_conflict)0x0;
      pBVar11->alloc = pJVar3;
      pBVar11->lastUsedNodePrevNextField = (Type)pBVar11;
      (pBVar2->globOptData).maybeTempObjectSyms = pBVar11;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(pBVar11,i);
    if (bVar5 == false) {
      pBVar11 = (pBVar2->globOptData).canStoreTempObjectSyms;
      if (pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        return;
      }
      BVSparse<Memory::JitArenaAllocator>::Clear(pBVar11,i);
      return;
    }
    if ((instr->m_opcode == NewScObjectLiteral) && (this->prePassLoop == (Loop *)0x0)) {
      this_02 = IR::Opnd::AsIntConstOpnd(instr->m_src1);
      this_03 = Func::GetJITFunctionBody(instr->m_func);
      offset = IR::IntConstOpnd::AsUint32(this_02);
      pPVar12 = JITTimeFunctionBody::ReadPropertyIdArrayFromAuxData(this_03,offset);
      if (pPVar12->hadDuplicates == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x41f8,"(!propIds->hadDuplicates)","!propIds->hadDuplicates");
        if (!bVar5) goto LAB_00442a5c;
        *puVar9 = 0;
      }
      pBVar13 = (pBVar2->globOptData).stackLiteralInitFldDataMap;
      if (pBVar13 ==
          (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)0x0) {
        pBVar13 = (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)new<Memory::JitArenaAllocator>(0x38,this->alloc,0x3d6ef4);
        JsUtil::
        BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::BaseDictionary(pBVar13,this->alloc,0);
        (pBVar2->globOptData).stackLiteralInitFldDataMap = pBVar13;
      }
      else {
        bVar5 = JsUtil::
                BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(pBVar13,(StackSym **)&data.currentInitFldCount);
        if (bVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x4200,"(!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym))",
                             "!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym)");
          if (!bVar5) goto LAB_00442a5c;
          *puVar9 = 0;
        }
      }
      data.propIds._0_4_ = 0;
      local_58 = (undefined1  [8])pPVar12;
      JsUtil::
      BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)(pBVar2->globOptData).stackLiteralInitFldDataMap,
                 (StackSym **)&data.currentInitFldCount,(StackLiteralInitFldData *)local_58);
    }
    pBVar11 = (pBVar2->globOptData).canStoreTempObjectSyms;
    if (pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
      pJVar3 = this->alloc;
      pBVar11->head = (Type_conflict)0x0;
      pBVar11->lastFoundIndex = (Type_conflict)0x0;
      pBVar11->alloc = pJVar3;
      pBVar11->lastUsedNodePrevNextField = (Type)pBVar11;
      (pBVar2->globOptData).canStoreTempObjectSyms = pBVar11;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(pBVar11,i);
  }
  return;
}

Assistant:

void
GlobOpt::TrackTempObjectSyms(IR::Instr * instr, IR::RegOpnd * opnd)
{
    // If it is marked as dstIsTempObject, we should have mark temped it, or type specialized it to Ld_I4.
    Assert(!instr->dstIsTempObject || ObjectTempVerify::CanMarkTemp(instr, nullptr));
    GlobOptBlockData& globOptData = *CurrentBlockData();
    bool canStoreTemp = false;
    bool maybeTemp = false;
    if (OpCodeAttr::TempObjectProducing(instr->m_opcode))
    {
        maybeTemp = instr->dstIsTempObject;

        // We have to make sure that lower will always generate code to do stack allocation
        // before we can store any other stack instance onto it. Otherwise, we would not
        // walk object to box the stack property.
        canStoreTemp = instr->dstIsTempObject && ObjectTemp::CanStoreTemp(instr);
    }
    else if (OpCodeAttr::TempObjectTransfer(instr->m_opcode))
    {
        // Need to check both sources, GetNewScObject has two srcs for transfer.
        // No need to get var equiv sym here as transfer of type spec value does not transfer a mark temp object.
        maybeTemp = globOptData.maybeTempObjectSyms && (
            (instr->GetSrc1()->IsRegOpnd() && globOptData.maybeTempObjectSyms->Test(instr->GetSrc1()->AsRegOpnd()->m_sym->m_id))
            || (instr->GetSrc2() && instr->GetSrc2()->IsRegOpnd() && globOptData.maybeTempObjectSyms->Test(instr->GetSrc2()->AsRegOpnd()->m_sym->m_id)));

        canStoreTemp = globOptData.canStoreTempObjectSyms && (
            (instr->GetSrc1()->IsRegOpnd() && globOptData.canStoreTempObjectSyms->Test(instr->GetSrc1()->AsRegOpnd()->m_sym->m_id))
            && (!instr->GetSrc2() || (instr->GetSrc2()->IsRegOpnd() && globOptData.canStoreTempObjectSyms->Test(instr->GetSrc2()->AsRegOpnd()->m_sym->m_id))));

        AssertOrFailFast(!canStoreTemp || instr->dstIsTempObject);
        AssertOrFailFast(!maybeTemp || instr->dstIsTempObject);
    }

    // Need to get the var equiv sym as assignment of type specialized sym kill the var sym value anyway.
    StackSym * sym = opnd->m_sym;
    if (!sym->IsVar())
    {
        sym = sym->GetVarEquivSym(nullptr);
        if (sym == nullptr)
        {
            return;
        }
    }

    SymID symId = sym->m_id;
    if (maybeTemp)
    {
        // Only var sym should be temp objects
        Assert(opnd->m_sym == sym);

        if (globOptData.maybeTempObjectSyms == nullptr)
        {
            globOptData.maybeTempObjectSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
        }
        globOptData.maybeTempObjectSyms->Set(symId);

        if (canStoreTemp)
        {
            if (instr->m_opcode == Js::OpCode::NewScObjectLiteral && !this->IsLoopPrePass())
            {
                // For object literal, we install the final type up front.
                // If there are bailout before we finish initializing all the fields, we need to
                // zero out the rest if we stack allocate the literal, so that the boxing would not
                // try to box trash pointer in the properties.

                // Although object Literal initialization can be done lexically, BailOnNoProfile may cause some path
                // to disappear. Do it is flow base make it easier to stop propagate those entries.

                IR::IntConstOpnd * propertyArrayIdOpnd = instr->GetSrc1()->AsIntConstOpnd();
                const Js::PropertyIdArray * propIds = instr->m_func->GetJITFunctionBody()->ReadPropertyIdArrayFromAuxData(propertyArrayIdOpnd->AsUint32());

                // Duplicates are removed by parser
                Assert(!propIds->hadDuplicates);

                if (globOptData.stackLiteralInitFldDataMap == nullptr)
                {
                    globOptData.stackLiteralInitFldDataMap = JitAnew(alloc, StackLiteralInitFldDataMap, alloc);
                }
                else
                {
                    Assert(!globOptData.stackLiteralInitFldDataMap->ContainsKey(sym));
                }
                StackLiteralInitFldData data = { propIds, 0};
                globOptData.stackLiteralInitFldDataMap->AddNew(sym, data);
            }

            if (globOptData.canStoreTempObjectSyms == nullptr)
            {
                globOptData.canStoreTempObjectSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
            }
            globOptData.canStoreTempObjectSyms->Set(symId);
        }
        else if (globOptData.canStoreTempObjectSyms)
        {
            globOptData.canStoreTempObjectSyms->Clear(symId);
        }
    }
    else
    {
        Assert(!canStoreTemp);
        if (globOptData.maybeTempObjectSyms)
        {
            if (globOptData.canStoreTempObjectSyms)
            {
                globOptData.canStoreTempObjectSyms->Clear(symId);
            }
            globOptData.maybeTempObjectSyms->Clear(symId);
        }
        else
        {
            Assert(!globOptData.canStoreTempObjectSyms);
        }

        // The symbol is being assigned to, the sym shouldn't still be in the stackLiteralInitFldDataMap
        Assert(this->IsLoopPrePass() ||
            globOptData.stackLiteralInitFldDataMap == nullptr
            || globOptData.stackLiteralInitFldDataMap->Count() == 0
            || !globOptData.stackLiteralInitFldDataMap->ContainsKey(sym));
    }
}